

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chorus.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_1368b5::ChorusState::deviceUpdate(ChorusState *this,ALCdevice *Device)

{
  pointer ptr;
  pointer pfVar1;
  pointer pfVar2;
  uint uVar3;
  pointer pfVar4;
  size_type __n;
  pointer __s;
  allocator_type local_29;
  vector<float,_al::allocator<float,_16UL>_> local_28;
  
  uVar3 = (uint)((float)Device->Frequency * 0.032);
  if (uVar3 == 0xffffffff) {
    __n = 1;
  }
  else {
    uVar3 = uVar3 >> 1 | uVar3;
    uVar3 = uVar3 >> 2 | uVar3;
    uVar3 = uVar3 >> 4 | uVar3;
    uVar3 = uVar3 >> 8 | uVar3;
    __n = (size_type)((uVar3 >> 0x10 | uVar3) + 1);
  }
  __s = (this->mSampleBuffer).super__Vector_base<float,_al::allocator<float,_16UL>_>._M_impl.
        super__Vector_impl_data._M_start;
  pfVar4 = (this->mSampleBuffer).super__Vector_base<float,_al::allocator<float,_16UL>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((long)pfVar4 - (long)__s >> 2 != __n) {
    std::vector<float,_al::allocator<float,_16UL>_>::vector(&local_28,__n,&local_29);
    ptr = (this->mSampleBuffer).super__Vector_base<float,_al::allocator<float,_16UL>_>._M_impl.
          super__Vector_impl_data._M_start;
    pfVar1 = (this->mSampleBuffer).super__Vector_base<float,_al::allocator<float,_16UL>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pfVar2 = (this->mSampleBuffer).super__Vector_base<float,_al::allocator<float,_16UL>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (this->mSampleBuffer).super__Vector_base<float,_al::allocator<float,_16UL>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_28.super__Vector_base<float,_al::allocator<float,_16UL>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->mSampleBuffer).super__Vector_base<float,_al::allocator<float,_16UL>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_28.super__Vector_base<float,_al::allocator<float,_16UL>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->mSampleBuffer).super__Vector_base<float,_al::allocator<float,_16UL>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_28.super__Vector_base<float,_al::allocator<float,_16UL>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    pfVar4 = local_28.super__Vector_base<float,_al::allocator<float,_16UL>_>._M_impl.
             super__Vector_impl_data._M_finish;
    __s = local_28.super__Vector_base<float,_al::allocator<float,_16UL>_>._M_impl.
          super__Vector_impl_data._M_start;
    local_28.super__Vector_base<float,_al::allocator<float,_16UL>_>._M_impl.super__Vector_impl_data.
    _M_start = ptr;
    local_28.super__Vector_base<float,_al::allocator<float,_16UL>_>._M_impl.super__Vector_impl_data.
    _M_finish = pfVar1;
    local_28.super__Vector_base<float,_al::allocator<float,_16UL>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = pfVar2;
    if (ptr != (pointer)0x0) {
      al_free(ptr);
      __s = (this->mSampleBuffer).super__Vector_base<float,_al::allocator<float,_16UL>_>._M_impl.
            super__Vector_impl_data._M_start;
      pfVar4 = (this->mSampleBuffer).super__Vector_base<float,_al::allocator<float,_16UL>_>._M_impl.
               super__Vector_impl_data._M_finish;
    }
  }
  if (__s != pfVar4) {
    memset(__s,0,((long)pfVar4 + (-4 - (long)__s) & 0xfffffffffffffffcU) + 4);
  }
  memset(this->mGains,0,0x100);
  return;
}

Assistant:

void ChorusState::deviceUpdate(const ALCdevice *Device)
{
    constexpr float max_delay{maxf(AL_CHORUS_MAX_DELAY, AL_FLANGER_MAX_DELAY)};

    const auto frequency = static_cast<float>(Device->Frequency);
    const size_t maxlen{NextPowerOf2(float2uint(max_delay*2.0f*frequency) + 1u)};
    if(maxlen != mSampleBuffer.size())
        al::vector<float,16>(maxlen).swap(mSampleBuffer);

    std::fill(mSampleBuffer.begin(), mSampleBuffer.end(), 0.0f);
    for(auto &e : mGains)
    {
        std::fill(std::begin(e.Current), std::end(e.Current), 0.0f);
        std::fill(std::begin(e.Target), std::end(e.Target), 0.0f);
    }
}